

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.cpp
# Opt level: O2

int __thiscall zmq::msg_t::init_buffer(msg_t *this,void *buf_,size_t size_)

{
  int iVar1;
  void *__dest;
  
  iVar1 = init_size(this,size_);
  if (iVar1 < 0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    if (size_ != 0) {
      __dest = data(this);
      memcpy(__dest,buf_,size_);
    }
  }
  return iVar1;
}

Assistant:

int zmq::msg_t::init_buffer (const void *buf_, size_t size_)
{
    const int rc = init_size (size_);
    if (unlikely (rc < 0)) {
        return -1;
    }
    if (size_) {
        // NULL and zero size is allowed
        assert (NULL != buf_);
        memcpy (data (), buf_, size_);
    }
    return 0;
}